

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::LogDet::dim_forward
          (Dim *__return_storage_ptr__,LogDet *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  uint uVar3;
  initializer_list<unsigned_int> x;
  uint local_14;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pDVar1->nd < 3) {
    if (pDVar1->nd == 2) {
      uVar3 = pDVar1->d[1];
    }
    else {
      uVar3 = 1;
    }
    if (pDVar1->d[0] == uVar3) {
      x._M_len = 1;
      x._M_array = &local_14;
      Dim::Dim(__return_storage_ptr__,x);
      return __return_storage_ptr__;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Bad arguments in LogDet: ");
  poVar2 = operator<<(poVar2,xs);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to LogDet");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim LogDet::dim_forward(const vector<Dim>& xs) const {
    if (xs[0].ndims() > 2 || (xs[0].rows() != xs[0].cols())) {
        cerr << "Bad arguments in LogDet: " << xs << endl;
        throw std::invalid_argument("invalid arguments to LogDet");
    }
    return Dim({1});
}